

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m2v_LU_mult(m2v *LU,int *rp,int *cp,m2v *X,m2v *Y_out)

{
  uint *puVar1;
  int iVar2;
  m2v_base *pmVar3;
  m2v_base *pmVar4;
  m2v_base *pmVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  
  iVar14 = Y_out->n_row;
  if (0 < iVar14) {
    iVar11 = Y_out->row_stride;
    iVar7 = 0;
    do {
      if (0 < iVar11) {
        uVar12 = iVar11 * iVar7;
        pmVar3 = Y_out->e;
        lVar15 = 0;
        do {
          pmVar3[(ulong)uVar12 + lVar15] = 0;
          lVar15 = lVar15 + 1;
          iVar11 = Y_out->row_stride;
        } while (lVar15 < iVar11);
        iVar14 = Y_out->n_row;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar14);
  }
  uVar12 = LU->n_row;
  if (0 < (int)uVar12) {
    lVar15 = 0;
    do {
      if (lVar15 < LU->n_col) {
        iVar14 = rp[lVar15];
        pmVar3 = LU->e;
        lVar18 = (long)LU->n_col;
        do {
          lVar16 = lVar18 + -1;
          uVar12 = (uint)lVar16;
          uVar8 = uVar12 + 0x1f;
          if (-1 < (int)uVar12) {
            uVar8 = uVar12;
          }
          if (((pmVar3[((int)uVar8 >> 5) + LU->row_stride * (int)lVar15] >> (uVar12 & 0x1f) & 1) !=
               0) && (iVar11 = Y_out->row_stride, 0 < (long)iVar11)) {
            iVar7 = cp[lVar18 + -1];
            iVar2 = X->row_stride;
            pmVar4 = X->e;
            pmVar5 = Y_out->e;
            lVar18 = 0;
            do {
              pmVar5[(long)iVar11 * (long)iVar14 + lVar18] =
                   pmVar5[(long)iVar11 * (long)iVar14 + lVar18] ^
                   pmVar4[(long)iVar2 * (long)iVar7 + lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 < Y_out->row_stride);
          }
          lVar18 = lVar16;
        } while (lVar15 < lVar16);
        uVar12 = LU->n_row;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)uVar12);
    if (0 < (int)uVar12) {
      uVar8 = uVar12 - 2;
      uVar9 = (ulong)uVar12;
      do {
        uVar17 = (ulong)uVar8;
        uVar10 = uVar9 - 1;
        iVar14 = LU->n_col;
        if ((long)iVar14 < (long)uVar9) {
          if (0 < iVar14) {
            pmVar3 = LU->e;
            uVar17 = (long)iVar14;
            do {
              uVar13 = uVar17 - 1;
              if (((pmVar3[(int)(((uint)(uVar13 >> 5) & 0x7ffffff) + LU->row_stride * (int)uVar10)]
                    >> ((uint)uVar13 & 0x1f) & 1) != 0) &&
                 (lVar15 = (long)Y_out->row_stride, 0 < lVar15)) {
                iVar14 = rp[uVar17 - 1];
                iVar11 = rp[uVar10];
                pmVar4 = Y_out->e;
                lVar18 = 0;
                do {
                  puVar1 = pmVar4 + iVar11 * lVar15 + lVar18;
                  *puVar1 = *puVar1 ^ pmVar4[iVar14 * lVar15 + lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar18 < Y_out->row_stride);
              }
              bVar6 = 1 < (long)uVar17;
              uVar17 = uVar13;
            } while (bVar6);
          }
        }
        else {
          if (uVar9 < 2) {
            return;
          }
          pmVar3 = LU->e;
          do {
            uVar12 = (uint)uVar17;
            if (((pmVar3[(int)(((uint)(uVar17 >> 5) & 0x7ffffff) + LU->row_stride * (int)uVar10)] >>
                  (uVar12 & 0x1f) & 1) != 0) && (lVar15 = (long)Y_out->row_stride, 0 < lVar15)) {
              iVar14 = rp[uVar17];
              iVar11 = rp[uVar10];
              pmVar4 = Y_out->e;
              lVar18 = 0;
              do {
                puVar1 = pmVar4 + iVar11 * lVar15 + lVar18;
                *puVar1 = *puVar1 ^ pmVar4[iVar14 * lVar15 + lVar18];
                lVar18 = lVar18 + 1;
              } while (lVar18 < Y_out->row_stride);
            }
            uVar17 = uVar17 - 1;
          } while (0 < (int)uVar12);
        }
        uVar8 = uVar8 - 1;
        bVar6 = 1 < (long)uVar9;
        uVar9 = uVar10;
      } while (bVar6);
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_mult)(const MV_GEN_TYPE* LU,
		   const int* rp,
		   const int* cp,
		   const MV_GEN_TYPE* X,
		   MV_GEN_TYPE* Y_out)
{
	/* Check dimensions */
	assert(LU->n_col == X->n_row);
	assert(LU->n_row == Y_out->n_row);
	assert(X->n_col == Y_out->n_col);

	/* Clear out the rows in the target vector */
	for (int i = 0; i < Y_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(Y_out, i);
	}

	/* Multiply with U */
	for (int i = 0; i < LU->n_row; ++i) {
		const int t = rp[i];
		for (int j = LU->n_col - 1; j >= i; --j) {
			MV_GEN_N(_multadd_row)(X, cp[j],
					MV_GEN_N(_get_el)(LU, i, j),
					Y_out, t);
		}
	}

	/* Multiply with L */
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		}
	}
}